

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cc
# Opt level: O0

void __thiscall
gmath::RadialTangentialDistortion::getProperties
          (RadialTangentialDistortion *this,Properties *prop,int id)

{
  int in_stack_00000084;
  char *in_stack_00000088;
  double *in_stack_00000090;
  char *in_stack_00000098;
  Properties *in_stack_000000a0;
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [48];
  string local_38 [56];
  
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000088,in_stack_00000084);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  std::__cxx11::string::~string(local_38);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000088,in_stack_00000084);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  std::__cxx11::string::~string(local_68);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000088,in_stack_00000084);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  std::__cxx11::string::~string(local_88);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000088,in_stack_00000084);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  std::__cxx11::string::~string(local_a8);
  (anonymous_namespace)::getCameraKey_abi_cxx11_(in_stack_00000088,in_stack_00000084);
  std::__cxx11::string::c_str();
  gutil::Properties::putValue<double>(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  std::__cxx11::string::~string(local_c8);
  return;
}

Assistant:

void RadialTangentialDistortion::getProperties(gutil::Properties &prop, int id) const
{
  prop.putValue(getCameraKey("p1", id).c_str(), kd[0]);
  prop.putValue(getCameraKey("p2", id).c_str(), kd[1]);

  prop.putValue(getCameraKey("k1", id).c_str(), kd[2]);
  prop.putValue(getCameraKey("k2", id).c_str(), kd[3]);
  prop.putValue(getCameraKey("k3", id).c_str(), kd[4]);
}